

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O3

void __thiscall VPPOperator::~VPPOperator(VPPOperator *this)

{
  pointer pcVar1;
  pointer pCVar2;
  
  (this->super_BaseNode)._vptr_BaseNode = (_func_int **)&PTR__VPPOperator_0018d978;
  pcVar1 = (this->command)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->command).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_BaseNode)._vptr_BaseNode = (_func_int **)&PTR__BaseNode_0018d9d8;
  pCVar2 = (this->super_BaseNode).connections.
           super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit VPPOperator() : BaseNode("vpp operator") { }